

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::edit_distance::CreateUnifiedDiff
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *left,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *right,size_t context)

{
  value_type vVar1;
  unsigned_long uVar2;
  bool bVar3;
  ostream *poVar4;
  const_reference pvVar5;
  unsigned_long *puVar6;
  ostream *poVar7;
  reference pEVar8;
  difference_type dVar9;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  string *in_RDI;
  EditType edit;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  it;
  size_t n_suffix;
  size_t i;
  Hunk hunk;
  size_t prefix_context;
  stringstream ss;
  size_t edit_i;
  size_t r_i;
  size_t l_i;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  edits;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  value_type in_stack_fffffffffffffd14;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  *in_stack_fffffffffffffd18;
  undefined6 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd26;
  undefined1 in_stack_fffffffffffffd27;
  ostream *poVar10;
  undefined7 in_stack_fffffffffffffd40;
  undefined1 uVar11;
  int local_2a0;
  const_iterator in_stack_fffffffffffffd70;
  const_iterator in_stack_fffffffffffffd78;
  const_iterator in_stack_fffffffffffffd80;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  local_278;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  *local_270;
  unsigned_long local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffdc0;
  _List_node_base *in_stack_fffffffffffffdc8;
  stringstream local_1d8 [16];
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  avStack_1c8 [15];
  ostream *local_50;
  size_type local_48;
  unsigned_long local_40;
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  local_38;
  __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  CalculateOptimalEdits
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  local_40 = 0;
  local_48 = 0;
  local_50 = (ostream *)0x0;
  std::__cxx11::stringstream::stringstream(local_1d8);
  do {
    poVar10 = local_50;
    poVar4 = (ostream *)
             std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::size(&local_38);
    if (poVar4 <= poVar10) break;
    while( true ) {
      poVar10 = local_50;
      poVar4 = (ostream *)
               std::
               vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ::size(&local_38);
      uVar11 = false;
      if (poVar10 < poVar4) {
        pvVar5 = std::
                 vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 ::operator[](&local_38,(size_type)local_50);
        uVar11 = *pvVar5 == kMatch;
      }
      if ((bool)uVar11 == false) break;
      local_40 = local_40 + 1;
      local_48 = local_48 + 1;
      local_50 = local_50 + 1;
    }
    puVar6 = std::min<unsigned_long>(&local_40,(unsigned_long *)&local_20);
    uVar2 = *puVar6;
    anon_unknown_1::Hunk::Hunk
              ((Hunk *)CONCAT17(in_stack_fffffffffffffd27,
                                CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)),
               (size_t)in_stack_fffffffffffffd18,
               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    for (local_268 = uVar2; local_268 != 0; local_268 = local_268 - 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](local_10,local_40 - local_268);
      std::__cxx11::string::c_str();
      anon_unknown_1::Hunk::PushLine
                ((Hunk *)in_stack_fffffffffffffd80._M_current,
                 (char)((ulong)in_stack_fffffffffffffd78._M_current >> 0x38),
                 (char *)in_stack_fffffffffffffd70._M_current);
    }
    local_270 = (__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                 *)0x0;
    for (; poVar4 = local_50,
        poVar7 = (ostream *)
                 std::
                 vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
                 ::size(&local_38), poVar4 < poVar7; local_50 = local_50 + 1) {
      if (local_20 <= local_270) {
        in_stack_fffffffffffffd80 =
             std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::begin(in_stack_fffffffffffffd08);
        local_278 = __gnu_cxx::
                    __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                    ::operator+(in_stack_fffffffffffffd18,
                                CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        while( true ) {
          in_stack_fffffffffffffd78 =
               std::
               vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ::end(in_stack_fffffffffffffd08);
          bVar3 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                              *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             (__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                              *)in_stack_fffffffffffffd08);
          in_stack_fffffffffffffd27 = false;
          if (bVar3) {
            pEVar8 = __gnu_cxx::
                     __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                     ::operator*(&local_278);
            in_stack_fffffffffffffd27 = *pEVar8 == kMatch;
          }
          if ((bool)in_stack_fffffffffffffd27 == false) break;
          __gnu_cxx::
          __normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
          ::operator++(&local_278);
        }
        in_stack_fffffffffffffd70 =
             std::
             vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             ::end(in_stack_fffffffffffffd08);
        bVar3 = __gnu_cxx::operator==
                          ((__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                            *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                           (__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                            *)in_stack_fffffffffffffd08);
        in_stack_fffffffffffffd26 = true;
        if (!bVar3) {
          std::
          vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
          ::begin(in_stack_fffffffffffffd08);
          dVar9 = __gnu_cxx::operator-
                            ((__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                              *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             (__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                              *)in_stack_fffffffffffffd08);
          in_stack_fffffffffffffd26 =
               local_20 <=
               (__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
                *)(dVar9 - (long)local_50);
        }
        if ((bool)in_stack_fffffffffffffd26 != false) break;
      }
      pvVar5 = std::
               vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
               ::operator[](&local_38,(size_type)local_50);
      vVar1 = *pvVar5;
      if (vVar1 == kMatch) {
        in_stack_fffffffffffffd18 =
             (__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
              *)((long)&local_270->_M_current + 1);
LAB_00579f63:
        in_stack_fffffffffffffd14 = vVar1;
        local_270 = in_stack_fffffffffffffd18;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_10,local_40);
        std::__cxx11::string::c_str();
        anon_unknown_1::Hunk::PushLine
                  ((Hunk *)in_stack_fffffffffffffd80._M_current,
                   (char)((ulong)in_stack_fffffffffffffd78._M_current >> 0x38),
                   (char *)in_stack_fffffffffffffd70._M_current);
      }
      else {
        in_stack_fffffffffffffd18 =
             (__normal_iterator<const_testing::internal::edit_distance::EditType_*,_std::vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>_>
              *)0x0;
        if ((vVar1 == kRemove) || (local_270 = in_stack_fffffffffffffd18, vVar1 == kReplace))
        goto LAB_00579f63;
      }
      if ((vVar1 == kAdd) || (vVar1 == kReplace)) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](local_18,local_48);
        std::__cxx11::string::c_str();
        anon_unknown_1::Hunk::PushLine
                  ((Hunk *)in_stack_fffffffffffffd80._M_current,
                   (char)((ulong)in_stack_fffffffffffffd78._M_current >> 0x38),
                   (char *)in_stack_fffffffffffffd70._M_current);
      }
      local_40 = (vVar1 != kAdd) + local_40;
      local_48 = (vVar1 != kRemove) + local_48;
    }
    bVar3 = anon_unknown_1::Hunk::has_edits((Hunk *)&stack0xfffffffffffffda0);
    in_stack_fffffffffffffd10 = CONCAT13(bVar3,(int3)in_stack_fffffffffffffd10);
    if (bVar3) {
      in_stack_fffffffffffffd08 =
           (vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
            *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x1d8) {
        in_stack_fffffffffffffd08 = avStack_1c8;
      }
      anon_unknown_1::Hunk::PrintTo((Hunk *)CONCAT17(uVar11,in_stack_fffffffffffffd40),poVar10);
      local_2a0 = 0;
    }
    else {
      local_2a0 = 3;
    }
    anon_unknown_1::Hunk::~Hunk
              ((Hunk *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  } while (local_2a0 == 0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1d8);
  std::
  vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
  ::~vector((vector<testing::internal::edit_distance::EditType,_std::allocator<testing::internal::edit_distance::EditType>_>
             *)CONCAT17(in_stack_fffffffffffffd27,
                        CONCAT16(in_stack_fffffffffffffd26,in_stack_fffffffffffffd20)));
  return in_RDI;
}

Assistant:

std::string CreateUnifiedDiff(const std::vector<std::string>& left,
                              const std::vector<std::string>& right,
                              size_t context) {
  const std::vector<EditType> edits = CalculateOptimalEdits(left, right);

  size_t l_i = 0, r_i = 0, edit_i = 0;
  std::stringstream ss;
  while (edit_i < edits.size()) {
    // Find first edit.
    while (edit_i < edits.size() && edits[edit_i] == kMatch) {
      ++l_i;
      ++r_i;
      ++edit_i;
    }

    // Find the first line to include in the hunk.
    const size_t prefix_context = std::min(l_i, context);
    Hunk hunk(l_i - prefix_context + 1, r_i - prefix_context + 1);
    for (size_t i = prefix_context; i > 0; --i) {
      hunk.PushLine(' ', left[l_i - i].c_str());
    }

    // Iterate the edits until we found enough suffix for the hunk or the input
    // is over.
    size_t n_suffix = 0;
    for (; edit_i < edits.size(); ++edit_i) {
      if (n_suffix >= context) {
        // Continue only if the next hunk is very close.
        auto it = edits.begin() + static_cast<int>(edit_i);
        while (it != edits.end() && *it == kMatch) ++it;
        if (it == edits.end() ||
            static_cast<size_t>(it - edits.begin()) - edit_i >= context) {
          // There is no next edit or it is too far away.
          break;
        }
      }

      EditType edit = edits[edit_i];
      // Reset count when a non match is found.
      n_suffix = edit == kMatch ? n_suffix + 1 : 0;

      if (edit == kMatch || edit == kRemove || edit == kReplace) {
        hunk.PushLine(edit == kMatch ? ' ' : '-', left[l_i].c_str());
      }
      if (edit == kAdd || edit == kReplace) {
        hunk.PushLine('+', right[r_i].c_str());
      }

      // Advance indices, depending on edit type.
      l_i += edit != kAdd;
      r_i += edit != kRemove;
    }

    if (!hunk.has_edits()) {
      // We are done. We don't want this hunk.
      break;
    }

    hunk.PrintTo(&ss);
  }
  return ss.str();
}